

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

char * dialogName(void)

{
  int iVar1;
  char *pcVar2;
  
  dialogNameOnly();
  if (dialogNameOnly::lDialogName[0] != '\0') {
    iVar1 = isTerminalRunning();
    if (iVar1 != 0) {
      return dialogNameOnly::lDialogName;
    }
    pcVar2 = terminalName();
    if (pcVar2 != (char *)0x0) {
      return dialogNameOnly::lDialogName;
    }
  }
  return (char *)0x0;
}

Assistant:

static char * dialogName(void)
{
    char * lDialogName ;
    lDialogName = dialogNameOnly( ) ;
        if ( strlen(lDialogName) && ( isTerminalRunning() || terminalName() ) )
        {
                return lDialogName ;
        }
        else
        {
                return NULL ;
        }
}